

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::GetPDBDirectory
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  OutputInfo *pOVar1;
  allocator local_9;
  
  pOVar1 = GetOutputInfo(this,config);
  if (pOVar1 == (OutputInfo *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_9);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&pOVar1->PdbDir);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetPDBDirectory(const std::string& config) const
{
  if (OutputInfo const* info = this->GetOutputInfo(config)) {
    // Return the directory in which the target will be built.
    return info->PdbDir;
  }
  return "";
}